

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::SparseTextureCommitmentTestCase::iterate(SparseTextureCommitmentTestCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar4;
  char *description;
  uint *puVar5;
  qpTestResult testResult;
  TestContext *this_01;
  int l_1;
  uint uVar6;
  uint *puVar7;
  int l;
  uint uVar8;
  GLuint texture;
  Functions *local_1f0;
  uint *local_1e8;
  string *local_1e0;
  ostream *local_1d8;
  allocator<char> local_1d0 [32];
  undefined1 local_1b0 [384];
  Functions *pFVar3;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pFVar3 = (Functions *)CONCAT44(extraout_var,iVar2);
    local_1e0 = (string *)&this->field_0x90;
    local_1d8 = (ostream *)&this->field_0x88;
    local_1f0 = pFVar3;
    for (puVar5 = (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        puVar5 != (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
      puVar7 = (uint *)(this->mSupportedInternalFormats).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
      local_1e8 = puVar5;
      while( true ) {
        if (puVar7 == (uint *)(this->mSupportedInternalFormats).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish) break;
        iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                          (this,(ulong)*puVar5,(ulong)*puVar7);
        if ((char)iVar2 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,local_1d0);
          std::__cxx11::stringbuf::str(local_1e0);
          std::__cxx11::string::~string((string *)local_1b0);
          poVar4 = std::operator<<(local_1d8,"Testing sparse texture commitment for target: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*puVar5);
          poVar4 = std::operator<<(poVar4,", format: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*puVar7);
          std::operator<<(poVar4," - ");
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                    (this,pFVar3,(ulong)*puVar5,(ulong)*puVar7,&texture,3);
          for (uVar8 = 0; (int)uVar8 < (this->mState).levels; uVar8 = uVar8 + 1) {
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                      (this,pFVar3,(ulong)*puVar5,(ulong)*puVar7,&texture,(ulong)uVar8);
          }
          uVar6 = 0;
          uVar8 = 1;
          do {
            if ((this->mState).levels <= (int)uVar6) break;
            iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                              (this,local_1f0,(ulong)*local_1e8,(ulong)*puVar7,&texture,(ulong)uVar6
                              );
            puVar5 = local_1e8;
            pFVar3 = local_1f0;
            if ((char)iVar2 != '\0') {
              (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                        (this,local_1f0,(ulong)*local_1e8,(ulong)*puVar7,&texture,(ulong)uVar6);
              uVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                                (this,pFVar3,(ulong)*puVar5,(ulong)*puVar7,&texture,(ulong)uVar6);
            }
            uVar6 = uVar6 + 1;
          } while ((uVar8 & 1) != 0);
          pFVar3 = local_1f0;
          gl4cts::Texture::Delete(local_1f0,&texture);
          puVar5 = local_1e8;
          if ((((uVar8 & 1) == 0) ||
              (iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                                 (this,pFVar3,(ulong)*local_1e8,(ulong)*puVar7,&texture),
              (char)iVar2 == '\0')) ||
             (iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x10])
                                (this,pFVar3,(ulong)*puVar5,(ulong)*puVar7,&texture),
             (char)iVar2 == '\0')) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__cxx11::stringbuf::str();
            std::operator<<((ostream *)this_00,(string *)local_1d0);
            std::operator<<((ostream *)this_00,"Fail");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)local_1d0);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
            description = "Fail";
            testResult = QP_TEST_RESULT_FAIL;
            goto LAB_00ad5853;
          }
        }
        puVar7 = puVar7 + 1;
      }
    }
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00ad5853:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureCommitmentTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing sparse texture commitment for target: " << target << ", format: " << format << " - ";

			//Checking if written data into not committed region generates no error
			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
				writeDataToTexture(gl, target, format, texture, l);

			//Checking if written data into committed region is as expected
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = verifyTextureData(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			//verify errors
			result = result && verifyInvalidOperationErrors(gl, target, format, texture);
			result = result && verifyInvalidValueErrors(gl, target, format, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}